

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitStringDefinitions_nonenglishDuplicates_Test::unitStringDefinitions_nonenglishDuplicates_Test
          (unitStringDefinitions_nonenglishDuplicates_Test *this)

{
  unitStringDefinitions_nonenglishDuplicates_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__unitStringDefinitions_nonenglishDuplicates_Test_001b1d28;
  return;
}

Assistant:

TEST(unitStringDefinitions, nonenglishDuplicates)
{
    std::map<std::string, units::precise_unit> testMap;
    for (const auto& ustring : units::defined_unit_strings_non_english) {
        if (ustring.first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second)
            << "duplicate non english unit string " << ustring.first;
    }
}